

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O0

int webSocket_recv(int fd,uchar *data,uint dataMaxLen)

{
  ssize_t sVar1;
  uint local_3c;
  int local_38;
  uint retLen;
  int ret2;
  int ret;
  uchar *recvBuf;
  uchar *webSocketPackage;
  uchar *puStack_18;
  uint dataMaxLen_local;
  uchar *data_local;
  int fd_local;
  
  local_38 = 0;
  local_3c = 0;
  webSocketPackage._4_4_ = dataMaxLen;
  puStack_18 = data;
  data_local._0_4_ = fd;
  _ret2 = (uchar *)calloc(1,(ulong)dataMaxLen);
  memset(_ret2,0,(ulong)webSocketPackage._4_4_);
  sVar1 = recv((int)data_local,_ret2,(ulong)webSocketPackage._4_4_,0x4000);
  retLen = (uint)sVar1;
  if ((int)retLen < 1) {
    free(_ret2);
    data_local._4_4_ = retLen;
  }
  else {
    recvBuf = (uchar *)calloc(1,(long)(int)(retLen + 0x80));
    memset(recvBuf,0,(long)(int)(retLen + 0x80));
    local_38 = webSocket_dePackage(_ret2,retLen,recvBuf,retLen + 0x80,&local_3c);
    if ((local_38 == -0x10) && (local_3c != 0)) {
      webSocket_send((int)data_local,recvBuf,local_3c,true,WCT_PONG);
      printf("webSocket_recv : PING %d\r\n%s\r\n",(ulong)local_3c,recvBuf);
      free(_ret2);
      free(recvBuf);
      data_local._4_4_ = 0;
    }
    else if ((local_3c == 0) ||
            (((local_38 != -0x13 && (local_38 != -0x12)) && (local_38 != -0x14)))) {
      free(_ret2);
      free(recvBuf);
      data_local._4_4_ = -retLen;
    }
    else {
      memcpy(puStack_18,recvBuf,(ulong)local_3c);
      free(_ret2);
      free(recvBuf);
      data_local._4_4_ = local_3c;
    }
  }
  return data_local._4_4_;
}

Assistant:

int webSocket_recv(int fd, unsigned char *data, unsigned int dataMaxLen) {
    unsigned char *webSocketPackage, *recvBuf;
    int ret, ret2 = 0;
    unsigned int retLen = 0;
    //int i;

    recvBuf = (unsigned char *)calloc(1, sizeof(char)*dataMaxLen);  memset(recvBuf, 0, dataMaxLen);
    ret = (unsigned int)recv(fd, recvBuf, dataMaxLen, MSG_NOSIGNAL);
    if(ret > 0)
    {
        //------------------------------------------------------------------- 和客户端的连接操作
//        if(strncmp(recvBuf, "GET", 3) == 0)
//        {
//            ret2 = webSocket_serverLinkToClient(fd, recvBuf, ret);
//            free(recvBuf);
//            if(ret2 < 0)
//            {
//                memset(data, 0, dataMaxLen);
//                strcpy(data, "connect false !\r\n");
//                return strlen("connect false !\r\n");
//            }
//            memset(data, 0, dataMaxLen);
//            strcpy(data, "connect ...\r\n");
//            return strlen("connect ...\r\n");
//        }

        //------------------------------------------------------------------- 正常数据交换

        //printf("webSocket_recv : %d\r\n", ret);
        //---------- websocket数据打包 ----------
        webSocketPackage = (unsigned char *)calloc(1, sizeof(char)*(ret + 128));  memset(webSocketPackage, 0, (ret + 128));
        ret2 = webSocket_dePackage(recvBuf, (unsigned int)ret, webSocketPackage, (unsigned int)(ret + 128), &retLen);
        if(ret2 == WCT_PING && retLen > 0)      // 解析为ping包, 自动回pong
        {
            webSocket_send(fd, webSocketPackage, retLen, true, WCT_PONG);
            // 显示数据
            printf("webSocket_recv : PING %d\r\n%s\r\n" , retLen, webSocketPackage);
            free(recvBuf);
            free(webSocketPackage);
            return WCT_NULL;
        }
        else if(retLen > 0 && (ret2 == WCT_TXTDATA || ret2 == WCT_BINDATA || ret2 == WCT_MINDATA))  // 解析为数据包
        {
            memcpy(data, webSocketPackage, retLen);     // 把解析得到的数据复制出去
            /*
            // 显示数据
            if(webSocketPackage[0] >= ' ' && webSocketPackage[0] <= '~')
            {
                printf("\r\nwebSocket_recv : New Package StrFile ret2:%d/retLen:%d\r\n%s\r\n" , ret2, retLen, webSocketPackage);
            }
            else
            {
                printf("\r\nwebSocket_recv : New Package BinFile ret2:%d/retLen:%d\r\n" , ret2, retLen);
                for(i = 0; i < retLen; i++) printf("%.2X ", webSocketPackage[i]); printf("\r\n");
            }*/
            free(recvBuf);
            free(webSocketPackage);
            return retLen;
        }/*
        else
        {
            // 显示数据
            if(recvBuf[0] >= ' ' && recvBuf[0] <= '~')
                printf("\r\nwebSocket_recv : ret:%d/ret2:%d/retLen:%d\r\n%s\r\n" , ret, ret2, retLen, recvBuf);
            else
            {
                printf("\r\nwebSocket_recv : ret:%d/ret2:%d/retLen:%d\r\n%s\r\n" , ret, ret2, retLen, recvBuf);
                for(i = 0; i < ret; i++) printf("%.2X ", recvBuf[i]); printf("\r\n");
            }
        }*/
        free(recvBuf);
        free(webSocketPackage);
        return -ret;
    }
    else
    {
        free(recvBuf);
        return ret;
    }
}